

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_colorspace_check_xy(png_XYZ *XYZ,png_xy *xy)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  png_fixed_point pVar19;
  int iVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  png_xy xy_test;
  int local_6c;
  png_xy local_50;
  
  uVar1 = xy->redx;
  uVar7 = 1;
  if (((((100000 < uVar1) || (iVar6 = xy->redy, (int)(100000 - uVar1) < iVar6 || iVar6 < 0)) ||
       (uVar2 = xy->greenx, 100000 < uVar2)) ||
      ((iVar15 = xy->greeny, (int)(100000 - uVar2) < iVar15 || iVar15 < 0 ||
       (uVar3 = xy->bluex, 100000 < uVar3)))) ||
     ((iVar10 = xy->bluey, (int)(100000 - uVar3) < iVar10 || iVar10 < 0 ||
      (uVar4 = xy->whitex, 100000 < uVar4)))) {
LAB_00109707:
    iVar20 = 0;
    goto LAB_0010970a;
  }
  iVar18 = xy->whitey;
  iVar20 = 0;
  if ((int)(100000 - uVar4) < iVar18 || iVar18 < 5) goto LAB_0010970a;
  iVar8 = uVar2 - uVar3;
  iVar11 = iVar6 - iVar10;
  bVar5 = false;
  if (iVar11 != 0 && iVar8 != 0) {
    dVar21 = floor(((double)iVar11 * (double)iVar8) / 7.0 + 0.5);
    iVar20 = (int)dVar21;
    bVar5 = 2147483647.0 < dVar21 || dVar21 < -2147483648.0;
  }
  iVar16 = 0;
  if (!bVar5) {
    iVar9 = iVar15 - iVar10;
    iVar12 = uVar1 - uVar3;
    bVar5 = false;
    if (iVar12 != 0 && iVar9 != 0) {
      dVar21 = floor(((double)iVar12 * (double)iVar9) / 7.0 + 0.5);
      iVar16 = (int)dVar21;
      bVar5 = 2147483647.0 < dVar21 || dVar21 < -2147483648.0;
    }
    if (!bVar5) {
      iVar13 = iVar18 - iVar10;
      bVar5 = false;
      iVar17 = 0;
      if (iVar13 != 0 && uVar2 != uVar3) {
        dVar21 = floor(((double)iVar13 * (double)iVar8) / 7.0 + 0.5);
        bVar5 = 2147483647.0 < dVar21 || dVar21 < -2147483648.0;
        iVar17 = (int)dVar21;
        if (2147483647.0 < dVar21 || dVar21 < -2147483648.0) {
          iVar17 = iVar20;
        }
      }
      if (!bVar5) {
        iVar14 = uVar4 - uVar3;
        bVar5 = false;
        iVar8 = 0;
        if (iVar14 != 0 && iVar15 != iVar10) {
          dVar21 = floor(((double)iVar14 * (double)iVar9) / 7.0 + 0.5);
          bVar5 = 2147483647.0 < dVar21 || dVar21 < -2147483648.0;
          iVar8 = (int)dVar21;
          if (2147483647.0 < dVar21 || dVar21 < -2147483648.0) {
            iVar8 = iVar16;
          }
        }
        if (!bVar5) {
          iVar15 = 0;
          if (iVar17 - iVar8 == 0) {
            bVar5 = false;
            iVar15 = 0;
          }
          else {
            bVar5 = true;
            if ((iVar18 != 0) && (iVar20 != iVar16)) {
              dVar21 = floor(((double)(iVar20 - iVar16) * (double)iVar18) / (double)(iVar17 - iVar8)
                             + 0.5);
              iVar15 = (int)dVar21;
              bVar5 = -2147483648.0 <= dVar21 && dVar21 <= 2147483647.0;
            }
          }
          if (!(bool)(iVar18 < iVar15 & bVar5)) goto LAB_00109707;
          local_6c = 0;
          bVar5 = false;
          if (iVar6 != iVar10 && uVar4 != uVar3) {
            dVar21 = floor(((double)iVar14 * (double)iVar11) / 7.0 + 0.5);
            bVar5 = 2147483647.0 < dVar21 || dVar21 < -2147483648.0;
            local_6c = (int)dVar21;
            if (2147483647.0 < dVar21 || dVar21 < -2147483648.0) {
              local_6c = iVar17;
            }
          }
          if (!bVar5) {
            bVar5 = false;
            iVar6 = 0;
            if (uVar1 != uVar3 && iVar18 != iVar10) {
              dVar21 = floor(((double)iVar13 * (double)iVar12) / 7.0 + 0.5);
              bVar5 = 2147483647.0 < dVar21 || dVar21 < -2147483648.0;
              iVar6 = (int)dVar21;
              if (2147483647.0 < dVar21 || dVar21 < -2147483648.0) {
                iVar6 = iVar8;
              }
            }
            if (bVar5) {
              uVar7 = 2;
            }
            else {
              iVar10 = 0;
              if (local_6c - iVar6 == 0) {
                bVar5 = false;
              }
              else {
                bVar5 = true;
                if ((iVar18 != 0) && (iVar20 != iVar16)) {
                  dVar21 = floor(((double)(iVar20 - iVar16) * (double)iVar18) /
                                 (double)(local_6c - iVar6) + 0.5);
                  iVar10 = (int)dVar21;
                  bVar5 = dVar21 <= 2147483647.0 && -2147483648.0 <= dVar21;
                }
              }
              iVar6 = 0;
              if ((bool)(iVar18 < iVar10 & bVar5)) {
                dVar21 = floor(10000000000.0 / (double)iVar18 + 0.5);
                iVar18 = (int)dVar21;
                if (dVar21 < -2147483648.0) {
                  iVar18 = iVar6;
                }
                if (2147483647.0 < dVar21) {
                  iVar18 = 0;
                }
                dVar21 = (double)iVar15;
                dVar22 = floor(10000000000.0 / dVar21 + 0.5);
                iVar20 = (int)dVar22;
                if (dVar22 < -2147483648.0) {
                  iVar20 = iVar6;
                }
                if (2147483647.0 < dVar22) {
                  iVar20 = 0;
                }
                dVar22 = (double)iVar10;
                dVar23 = floor(10000000000.0 / dVar22 + 0.5);
                iVar8 = (int)dVar23;
                if (dVar23 < -2147483648.0) {
                  iVar8 = iVar6;
                }
                if (2147483647.0 < dVar23) {
                  iVar8 = 0;
                }
                iVar18 = iVar18 - (iVar8 + iVar20);
                if ((0 < iVar18) && (iVar15 != 0)) {
                  pVar19 = 0;
                  iVar6 = 0;
                  if (uVar1 != 0) {
                    dVar23 = floor(((double)(int)uVar1 * 100000.0) / dVar21 + 0.5);
                    if ((2147483647.0 < dVar23) || (dVar23 < -2147483648.0)) goto LAB_0010a116;
                    iVar6 = (int)dVar23;
                  }
                  XYZ->red_X = iVar6;
                  if (xy->redy != 0) {
                    dVar23 = floor(((double)xy->redy * 100000.0) / dVar21 + 0.5);
                    if ((2147483647.0 < dVar23) || (dVar23 < -2147483648.0)) goto LAB_0010a116;
                    pVar19 = (png_fixed_point)dVar23;
                  }
                  XYZ->red_Y = pVar19;
                  iVar6 = xy->redy + xy->redx;
                  iVar15 = 0;
                  if (iVar6 != 100000) {
                    dVar21 = floor(((double)(100000 - iVar6) * 100000.0) / dVar21 + 0.5);
                    if ((2147483647.0 < dVar21) || (dVar21 < -2147483648.0)) goto LAB_0010a116;
                    iVar15 = (int)dVar21;
                  }
                  XYZ->red_Z = iVar15;
                  pVar19 = 0;
                  if (iVar10 != 0) {
                    if (xy->greenx != 0) {
                      dVar21 = floor(((double)xy->greenx * 100000.0) / dVar22 + 0.5);
                      if ((2147483647.0 < dVar21) || (dVar21 < -2147483648.0)) goto LAB_0010a116;
                      pVar19 = (png_fixed_point)dVar21;
                    }
                    XYZ->green_X = pVar19;
                    pVar19 = 0;
                    iVar6 = 0;
                    if (xy->greeny != 0) {
                      dVar21 = floor(((double)xy->greeny * 100000.0) / dVar22 + 0.5);
                      if ((2147483647.0 < dVar21) || (dVar21 < -2147483648.0)) goto LAB_0010a116;
                      iVar6 = (int)dVar21;
                    }
                    XYZ->green_Y = iVar6;
                    iVar6 = xy->greeny + xy->greenx;
                    if (iVar6 != 100000) {
                      dVar21 = floor(((double)(100000 - iVar6) * 100000.0) / dVar22 + 0.5);
                      if ((2147483647.0 < dVar21) || (dVar21 < -2147483648.0)) goto LAB_0010a116;
                      pVar19 = (png_fixed_point)dVar21;
                    }
                    XYZ->green_Z = pVar19;
                    pVar19 = 0;
                    dVar21 = (double)iVar18;
                    iVar6 = 0;
                    if (xy->bluex != 0) {
                      dVar22 = floor(((double)xy->bluex * dVar21) / 100000.0 + 0.5);
                      if ((2147483647.0 < dVar22) || (dVar22 < -2147483648.0)) goto LAB_0010a116;
                      iVar6 = (int)dVar22;
                    }
                    XYZ->blue_X = iVar6;
                    if (xy->bluey != 0) {
                      dVar22 = floor(((double)xy->bluey * dVar21) / 100000.0 + 0.5);
                      if ((2147483647.0 < dVar22) || (dVar22 < -2147483648.0)) goto LAB_0010a116;
                      pVar19 = (png_fixed_point)dVar22;
                    }
                    XYZ->blue_Y = pVar19;
                    iVar6 = xy->bluey + xy->bluex;
                    iVar15 = 0;
                    if (iVar6 != 100000) {
                      dVar21 = floor((dVar21 * (double)(100000 - iVar6)) / 100000.0 + 0.5);
                      iVar20 = 0;
                      if (2147483647.0 < dVar21) goto LAB_0010a116;
                      if (dVar21 < -2147483648.0) goto LAB_0010970a;
                      iVar15 = (int)dVar21;
                    }
                    XYZ->blue_Z = iVar15;
                    iVar20 = 1;
                    uVar7 = 0;
                    goto LAB_0010970a;
                  }
                }
              }
            }
LAB_0010a116:
            iVar20 = 0;
            goto LAB_0010970a;
          }
        }
      }
    }
  }
  iVar20 = 0;
  uVar7 = 2;
LAB_0010970a:
  if ((char)iVar20 != '\0') {
    iVar6 = png_xy_from_XYZ(&local_50,XYZ);
    uVar7 = 1;
    if (iVar6 == 0) {
      uVar7 = png_colorspace_endpoints_match(xy,&local_50,5);
      uVar7 = uVar7 ^ 1;
    }
  }
  return uVar7;
}

Assistant:

static int
png_colorspace_check_xy(png_XYZ *XYZ, const png_xy *xy)
{
   int result;
   png_xy xy_test;

   /* As a side-effect this routine also returns the XYZ endpoints. */
   result = png_XYZ_from_xy(XYZ, xy);
   if (result != 0)
      return result;

   result = png_xy_from_XYZ(&xy_test, XYZ);
   if (result != 0)
      return result;

   if (png_colorspace_endpoints_match(xy, &xy_test,
       5/*actually, the math is pretty accurate*/) != 0)
      return 0;

   /* Too much slip */
   return 1;
}